

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotShadedEx<ImPlot::GetterYs<unsigned_int>,ImPlot::GetterYRef>
               (char *label_id,GetterYs<unsigned_int> *getter1,GetterYRef *getter2,bool fit2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint *puVar10;
  ImPlotPlot *pIVar11;
  ImPlotRange *pIVar12;
  ImPlotContext *pIVar13;
  bool bVar14;
  int iVar15;
  ImU32 col;
  ImDrawList *DrawList;
  undefined7 in_register_00000009;
  byte bVar16;
  int iVar17;
  uint uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  TransformerLinLin local_84;
  GetterYRef *local_80;
  GetterYs<unsigned_int> *local_78;
  undefined4 local_6c;
  uint local_68;
  uint local_64;
  ShadedRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLin>
  local_60;
  
  bVar14 = BeginItem(label_id,1);
  pIVar13 = GImPlot;
  if (bVar14) {
    if (GImPlot->FitThisFrame == true) {
      local_6c = (undefined4)CONCAT71(in_register_00000009,fit2);
      iVar15 = getter1->Count;
      if (0 < iVar15) {
        dVar1 = getter1->X0;
        dVar2 = getter1->XScale;
        puVar10 = getter1->Ys;
        iVar4 = getter1->Offset;
        iVar5 = getter1->Stride;
        pIVar11 = GImPlot->CurrentPlot;
        iVar6 = pIVar11->CurrentYAxis;
        uVar7 = (pIVar11->XAxis).Flags;
        pIVar12 = GImPlot->ExtentsY;
        uVar8 = pIVar11->YAxis[iVar6].Flags;
        iVar17 = 0;
        uVar18 = uVar8 & 0x20;
        local_64 = uVar18 >> 5;
        local_68 = uVar7 & 0x20;
        dVar19 = 0.0;
        do {
          dVar21 = dVar2 * dVar19 + dVar1;
          uVar9 = *(uint *)((long)puVar10 +
                           (long)(((iVar4 + iVar17) % iVar15 + iVar15) % iVar15) * (long)iVar5);
          dVar20 = (double)uVar9;
          if ((uVar7 >> 10 & 1) == 0) {
            if ((long)ABS(dVar21) < 0x7ff0000000000000) {
LAB_001ea9ea:
              if ((0.0 < dVar21) || (local_68 == 0)) {
                dVar3 = (pIVar13->ExtentsX).Min;
                dVar22 = dVar21;
                if (dVar3 <= dVar21) {
                  dVar22 = dVar3;
                }
                (pIVar13->ExtentsX).Min = dVar22;
                dVar3 = (pIVar13->ExtentsX).Max;
                dVar22 = dVar21;
                if (dVar21 <= dVar3) {
                  dVar22 = dVar3;
                }
                (pIVar13->ExtentsX).Max = dVar22;
              }
            }
          }
          else if ((((long)ABS(dVar21) < 0x7ff0000000000000) &&
                   (pIVar11->YAxis[iVar6].Range.Min <= dVar20)) &&
                  (dVar20 <= pIVar11->YAxis[iVar6].Range.Max)) goto LAB_001ea9ea;
          if ((uVar8 >> 10 & 1) == 0) {
            if ((uVar9 != 0) || (uVar18 == 0)) {
LAB_001eaa53:
              dVar21 = pIVar12[iVar6].Min;
              dVar3 = dVar20;
              if (dVar21 <= dVar20) {
                dVar3 = dVar21;
              }
              pIVar12[iVar6].Min = dVar3;
              dVar21 = pIVar13->ExtentsY[iVar6].Max;
              if (dVar20 <= dVar21) {
                dVar20 = dVar21;
              }
              pIVar13->ExtentsY[iVar6].Max = dVar20;
            }
          }
          else if ((((pIVar11->XAxis).Range.Min <= dVar21) && (dVar21 <= (pIVar11->XAxis).Range.Max)
                   ) && ((uVar9 == 0 & (byte)local_64) == 0)) goto LAB_001eaa53;
          dVar19 = dVar19 + 1.0;
          iVar17 = iVar17 + 1;
        } while (iVar15 != iVar17);
      }
      if ((fit2) && (iVar15 = getter2->Count, 0 < iVar15)) {
        dVar1 = getter2->X0;
        dVar2 = getter2->YRef;
        dVar19 = getter2->XScale;
        pIVar11 = pIVar13->CurrentPlot;
        iVar4 = pIVar11->CurrentYAxis;
        uVar7 = (pIVar11->XAxis).Flags;
        uVar8 = pIVar11->YAxis[iVar4].Flags;
        pIVar12 = pIVar13->ExtentsY + iVar4;
        bVar16 = dVar2 <= 0.0 & (byte)((uVar8 & 0x20) >> 5);
        dVar20 = 0.0;
        do {
          dVar21 = dVar19 * dVar20 + dVar1;
          if ((uVar7 >> 10 & 1) == 0) {
            if ((long)ABS(dVar21) < 0x7ff0000000000000) {
LAB_001eab67:
              if ((0.0 < dVar21) || ((uVar7 & 0x20) == 0)) {
                dVar3 = (pIVar13->ExtentsX).Min;
                dVar22 = dVar21;
                if (dVar3 <= dVar21) {
                  dVar22 = dVar3;
                }
                (pIVar13->ExtentsX).Min = dVar22;
                dVar3 = (pIVar13->ExtentsX).Max;
                dVar22 = dVar21;
                if (dVar21 <= dVar3) {
                  dVar22 = dVar3;
                }
                (pIVar13->ExtentsX).Max = dVar22;
              }
            }
          }
          else if ((((long)ABS(dVar21) < 0x7ff0000000000000) &&
                   (pIVar11->YAxis[iVar4].Range.Min <= dVar2)) &&
                  (dVar2 <= pIVar11->YAxis[iVar4].Range.Max)) goto LAB_001eab67;
          if ((uVar8 >> 10 & 1) == 0) {
            if ((ulong)ABS(dVar2) < 0x7ff0000000000000 && bVar16 == 0) {
LAB_001eabaa:
              dVar21 = dVar2;
              if (pIVar12->Min <= dVar2) {
                dVar21 = pIVar12->Min;
              }
              pIVar12->Min = dVar21;
              dVar21 = dVar2;
              if (dVar2 <= pIVar12->Max) {
                dVar21 = pIVar12->Max;
              }
              pIVar12->Max = dVar21;
            }
          }
          else if (((ulong)ABS(dVar2) < 0x7ff0000000000000 && bVar16 == 0) &&
                   ((pIVar11->XAxis).Range.Min <= dVar21 && dVar21 <= (pIVar11->XAxis).Range.Max))
          goto LAB_001eabaa;
          dVar20 = dVar20 + 1.0;
          iVar15 = iVar15 + -1;
        } while (iVar15 != 0);
      }
    }
    local_80 = getter2;
    local_78 = getter1;
    DrawList = GetPlotDrawList();
    if ((pIVar13->NextItemData).RenderFill == true) {
      col = ImGui::GetColorU32((pIVar13->NextItemData).Colors + 1);
      switch(GImPlot->Scales[GImPlot->CurrentPlot->CurrentYAxis]) {
      case 0:
        local_84.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
        ShadedRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLin>
        ::ShadedRenderer(&local_60,local_78,local_80,&local_84,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterYs<unsigned_int>,ImPlot::GetterYRef,ImPlot::TransformerLinLin>>
                  (&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 1:
        local_84.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
        ShadedRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>
                          *)&local_60,local_78,local_80,(TransformerLogLin *)&local_84,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterYs<unsigned_int>,ImPlot::GetterYRef,ImPlot::TransformerLogLin>>
                  ((ShadedRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>
                    *)&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 2:
        local_84.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
        ShadedRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
                          *)&local_60,local_78,local_80,(TransformerLinLog *)&local_84,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterYs<unsigned_int>,ImPlot::GetterYRef,ImPlot::TransformerLinLog>>
                  ((ShadedRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
                    *)&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 3:
        local_84.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
        ShadedRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>
                          *)&local_60,local_78,local_80,(TransformerLogLog *)&local_84,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterYs<unsigned_int>,ImPlot::GetterYRef,ImPlot::TransformerLogLog>>
                  ((ShadedRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>
                    *)&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
      }
    }
    pIVar13 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar13->NextItemData);
    pIVar13->PreviousItem = pIVar13->CurrentItem;
    pIVar13->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

inline void PlotShadedEx(const char* label_id, const Getter1& getter1, const Getter2& getter2, bool fit2) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter1.Count; ++i)
                FitPoint(getter1(i));
            if (fit2) {
                for (int i = 0; i < getter2.Count; ++i)
                    FitPoint(getter2(i));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList & DrawList = *GetPlotDrawList();
        if (s.RenderFill) {
            ImU32 col = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLinLin>(getter1,getter2,TransformerLinLin(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LogLin: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLogLin>(getter1,getter2,TransformerLogLin(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LinLog: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLinLog>(getter1,getter2,TransformerLinLog(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LogLog: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLogLog>(getter1,getter2,TransformerLogLog(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
            }
        }
        EndItem();
    }
}